

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_bfbs.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  pointer pcVar7;
  string jsongen2;
  string bfbs_file;
  string json_file;
  string schema_file;
  char *include_directories [4];
  string jsongen1;
  Parser parser2;
  Parser parser1;
  string local_12f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12d8;
  pointer local_12d0;
  string local_12c8;
  string local_12a8;
  string local_1288;
  char *local_1268;
  char *pcStack_1260;
  char *local_1258;
  undefined8 uStack_1250;
  undefined1 local_1240 [784];
  Parser local_f30;
  Parser local_7b0;
  
  local_1288._M_string_length = 0;
  local_1288.field_2._M_local_buf[0] = '\0';
  local_12a8._M_string_length = 0;
  local_12a8.field_2._M_local_buf[0] = '\0';
  local_12c8._M_string_length = 0;
  local_12c8.field_2._M_local_buf[0] = '\0';
  local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
  local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
  local_1288._M_dataplus._M_p = (pointer)&local_1288.field_2;
  bVar1 = flatbuffers::LoadFile("tests/monster_test.fbs",false,&local_1288);
  if (((!bVar1) ||
      (bVar1 = flatbuffers::LoadFile("tests/monsterdata_test.golden",false,&local_12a8), !bVar1)) ||
     (bVar1 = flatbuffers::LoadFile("tests/monster_test.bfbs",true,&local_12c8), !bVar1)) {
    puts("couldn\'t load files!");
    iVar6 = 1;
    goto LAB_0014e82a;
  }
  local_1258 = "tests/include_test";
  uStack_1250 = 0;
  local_1268 = "samples";
  pcStack_1260 = "tests";
  flatbuffers::IDLOptions::IDLOptions((IDLOptions *)&local_f30);
  flatbuffers::Parser::Parser(&local_7b0,(IDLOptions *)&local_f30);
  flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)&local_f30);
  bVar1 = flatbuffers::Parser::Parse(&local_7b0,local_1288._M_dataplus._M_p,&local_1268,(char *)0x0)
  ;
  if (!bVar1) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                  ,0x2d,"int main(int, const char **)");
  }
  flatbuffers::IDLOptions::IDLOptions((IDLOptions *)local_1240);
  flatbuffers::Parser::Parser(&local_f30,(IDLOptions *)local_1240);
  flatbuffers::IDLOptions::~IDLOptions((IDLOptions *)local_1240);
  bVar1 = flatbuffers::Parser::Deserialize
                    (&local_f30,(uint8_t *)local_12c8._M_dataplus._M_p,local_12c8._M_string_length);
  if (!bVar1) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                  ,0x33,"int main(int, const char **)");
  }
  bVar1 = flatbuffers::Parser::Parse(&local_7b0,local_12a8._M_dataplus._M_p,&local_1268,(char *)0x0)
  ;
  if (!bVar1) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                  ,0x37,"int main(int, const char **)");
  }
  bVar1 = flatbuffers::Parser::Parse(&local_f30,local_12a8._M_dataplus._M_p,&local_1268,(char *)0x0)
  ;
  if (!bVar1) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_bfbs.cpp"
                  ,0x39,"int main(int, const char **)");
  }
  local_1240._8_8_ = 0;
  local_1240[0x10] = false;
  local_1240._0_8_ = local_1240 + 0x10;
  puVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
  pcVar4 = flatbuffers::GenText(&local_7b0,puVar3,(string *)local_1240);
  if (pcVar4 == (char *)0x0) {
    local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
    local_12f8._M_string_length = 0;
    local_12f8.field_2._M_local_buf[0] = '\0';
    puVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&local_f30.builder_);
    pcVar4 = flatbuffers::GenText(&local_f30,puVar3,&local_12f8);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "The FlatBuffer has been parsed from JSON successfully.";
      _Var5._M_p = local_12f8._M_dataplus._M_p;
      pcVar7 = (pointer)local_1240._0_8_;
      if (local_1240._8_8_ == local_12f8._M_string_length) {
        iVar6 = 0;
        if (local_1240._8_8_ != 0) {
          local_12d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_12f8._M_dataplus._M_p;
          local_12d0 = (pointer)local_1240._0_8_;
          iVar2 = bcmp((void *)local_1240._0_8_,local_12f8._M_dataplus._M_p,local_1240._8_8_);
          _Var5._M_p = (pointer)local_12d8;
          pcVar7 = local_12d0;
          if (iVar2 != 0) goto LAB_0014e922;
        }
      }
      else {
LAB_0014e922:
        iVar6 = 0;
        printf("%s----------------\n%s",pcVar7,_Var5._M_p);
      }
    }
    else {
      iVar6 = 1;
      pcVar4 = "Couldn\'t serialize parsed data to JSON!";
    }
    puts(pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
      operator_delete(local_12f8._M_dataplus._M_p,
                      CONCAT71(local_12f8.field_2._M_allocated_capacity._1_7_,
                               local_12f8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    puts("Couldn\'t serialize parsed data to JSON!");
    iVar6 = 1;
  }
  if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
    operator_delete((void *)local_1240._0_8_,CONCAT71(local_1240._17_7_,local_1240[0x10]) + 1);
  }
  flatbuffers::Parser::~Parser(&local_f30);
  flatbuffers::Parser::~Parser(&local_7b0);
LAB_0014e82a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
    operator_delete(local_12c8._M_dataplus._M_p,
                    CONCAT71(local_12c8.field_2._M_allocated_capacity._1_7_,
                             local_12c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
    operator_delete(local_12a8._M_dataplus._M_p,
                    CONCAT71(local_12a8.field_2._M_allocated_capacity._1_7_,
                             local_12a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
    operator_delete(local_1288._M_dataplus._M_p,
                    CONCAT71(local_1288.field_2._M_allocated_capacity._1_7_,
                             local_1288.field_2._M_local_buf[0]) + 1);
  }
  return iVar6;
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schema_file;
  std::string json_file;
  std::string bfbs_file;
  bool ok =
      flatbuffers::LoadFile("tests/monster_test.fbs", false, &schema_file) &&
      flatbuffers::LoadFile("tests/monsterdata_test.golden", false,
                            &json_file) &&
      flatbuffers::LoadFile("tests/monster_test.bfbs", true, &bfbs_file);
  if (!ok) {
    printf("couldn't load files!\n");
    return 1;
  }

  const char *include_directories[] = { "samples", "tests",
                                        "tests/include_test", nullptr };
  // parse fbs schema
  flatbuffers::Parser parser1;
  ok = parser1.Parse(schema_file.c_str(), include_directories);
  assert(ok);

  // inizialize parser by deserializing bfbs schema
  flatbuffers::Parser parser2;
  ok = parser2.Deserialize(reinterpret_cast<const uint8_t *>(bfbs_file.c_str()),
                           bfbs_file.length());
  assert(ok);

  // parse json in parser from fbs and bfbs
  ok = parser1.Parse(json_file.c_str(), include_directories);
  assert(ok);
  ok = parser2.Parse(json_file.c_str(), include_directories);
  assert(ok);

  // to ensure it is correct, we now generate text back from the binary,
  // and compare the two:
  std::string jsongen1;
  if (GenText(parser1, parser1.builder_.GetBufferPointer(), &jsongen1)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  std::string jsongen2;
  if (GenText(parser2, parser2.builder_.GetBufferPointer(), &jsongen2)) {
    printf("Couldn't serialize parsed data to JSON!\n");
    return 1;
  }

  if (jsongen1 != jsongen2) {
    printf("%s----------------\n%s", jsongen1.c_str(), jsongen2.c_str());
  }

  printf("The FlatBuffer has been parsed from JSON successfully.\n");
}